

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int setup_decode_folder(archive_read *a,_7z_folder *folder,int header)

{
  undefined1 auVar1 [16];
  _7zip *zip;
  ulong uVar2;
  unsigned_long uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint64_t uVar9;
  size_t *psVar10;
  size_t __n;
  uchar *puVar11;
  int iVar12;
  _7z_coder *p_Var13;
  char *fmt;
  _7z_coder *coder1;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  _7z_coder *p_Var18;
  uchar *b [3];
  int idx [3];
  void *buff;
  size_t s [3];
  _7z_coder *scoder [3];
  undefined1 local_d8 [16];
  void *local_c8;
  int local_b8 [4];
  _7z_coder *local_a8;
  _7z_coder *local_a0;
  void *local_98;
  void *local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  _7z_coder *local_68 [4];
  undefined8 local_48;
  undefined1 auStack_40 [16];
  
  zip = (_7zip *)a->format->data;
  lVar16 = 0x9c6;
  do {
    free((void *)(&(zip->si).pi.pos)[lVar16]);
    (&(zip->si).pi.pos)[lVar16] = 0;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x9c9);
  pcVar17 = "archive header";
  if (header == 0) {
    pcVar17 = "file content";
  }
  uVar8 = (uint)folder->numPackedStreams;
  zip->pack_stream_remaining = uVar8;
  zip->pack_stream_index = folder->packIndex;
  uVar9 = folder_uncompressed_size(folder);
  zip->folder_outbytes_remaining = uVar9;
  zip->uncompressed_buffer_bytes_remaining = 0;
  uVar2 = folder->numCoders;
  if (uVar2 == 0) {
    iVar12 = 0;
  }
  else {
    iVar12 = 0;
    uVar6 = 1;
    uVar15 = 0;
    do {
      uVar14 = uVar6;
      uVar3 = folder->coders[uVar15].codec;
      if ((long)uVar3 < 0x6f10101) {
        if (uVar3 == 0x303011b) {
          iVar12 = iVar12 + 1;
        }
      }
      else if (((uVar3 == 0x6f10101) || (uVar3 == 0x6f10701)) || (uVar3 == 0x6f10303)) {
        zip->has_encrypted_entries = 1;
        if (a->entry != (archive_entry *)0x0) {
          archive_entry_set_is_data_encrypted(a->entry,'\x01');
          archive_entry_set_is_metadata_encrypted(a->entry,'\x01');
        }
        fmt = "The %s is encrypted, but currently not supported";
        goto LAB_005c023b;
      }
      uVar6 = (ulong)((int)uVar14 + 1);
      uVar15 = uVar14;
    } while (uVar14 < uVar2);
  }
  if (zip->has_encrypted_entries == -1) {
    zip->has_encrypted_entries = 0;
  }
  if (iVar12 < 2 && (iVar12 != 0 || uVar2 < 3)) {
    coder1 = folder->coders;
    p_Var18 = coder1 + 1;
    p_Var13 = (_7z_coder *)0x0;
    if (uVar2 == 2) {
      p_Var13 = p_Var18;
    }
    if (iVar12 != 0) {
      local_68[2] = &setup_decode_folder::coder_copy;
      local_68[0] = &setup_decode_folder::coder_copy;
      local_68[1] = &setup_decode_folder::coder_copy;
      local_c8 = (void *)0x0;
      local_d8 = (undefined1  [16])0x0;
      local_48._0_4_ = 0xffffffff;
      local_48._4_4_ = 0xffffffff;
      auStack_40._8_8_ = 0xffffffffffffffff;
      auStack_40._0_8_ = 0xffffffffffffffff;
      local_78 = 0;
      local_88 = (undefined1  [16])0x0;
      local_b8[0] = 0;
      local_b8[1] = 1;
      local_b8[2] = 2;
      if (uVar2 == 4) {
        if (((coder1[3].codec == 0x303011b) && (folder->numInStreams == 7)) &&
           (uVar8 == 4 && folder->numOutStreams == 4)) {
          if (folder->bindPairs->inIndex == 5) {
            local_b8[0] = 1;
            local_b8[1] = 2;
            local_b8[2] = 0;
            auVar1 = *(undefined1 (*) [16])folder->unPackSize;
            auStack_40._0_8_ = auVar1._8_8_;
            auStack_40._8_4_ = auVar1._0_4_;
            auStack_40._12_4_ = auVar1._4_4_;
            p_Var13 = coder1 + 2;
            local_68[1] = p_Var18;
            local_68[2] = coder1;
          }
          else {
            if (coder1->codec == 0) {
              p_Var13 = coder1 + 2;
              if (coder1[1].codec == 0) goto LAB_005c035c;
              uVar3 = p_Var13->codec;
              p_Var13 = p_Var18;
            }
            else {
              if (coder1[1].codec != 0) goto LAB_005c060f;
              uVar3 = coder1[2].codec;
              p_Var13 = coder1;
            }
            if (uVar3 != 0) goto LAB_005c060f;
          }
LAB_005c035c:
          p_Var18 = coder1 + 3;
          psVar10 = folder->unPackSize + 2;
          local_a8 = p_Var13;
          goto LAB_005c03d7;
        }
LAB_005c060f:
        pcVar17 = "Unsupported form of BCJ2 streams";
        iVar12 = -1;
LAB_005c061e:
        archive_set_error(&a->archive,iVar12,pcVar17);
        goto LAB_005c0625;
      }
      if (((uVar2 != 2) || (uVar8 != 4 || p_Var18->codec != 0x303011b)) ||
         ((folder->numInStreams != 5 || (folder->numOutStreams != 2)))) goto LAB_005c060f;
      psVar10 = folder->unPackSize;
      local_a8 = coder1;
LAB_005c03d7:
      zip->main_stream_bytes_remaining = *psVar10;
      iVar12 = seek_pack(a);
      if (iVar12 < 0) {
        return iVar12;
      }
      zip->pack_stream_bytes_unconsumed = zip->pack_stream_inbytes_remaining;
      local_a0 = p_Var18;
      read_consume(a);
      lVar16 = 0;
      do {
        p_Var18 = local_68[lVar16];
        uVar8 = seek_pack(a);
        if ((int)uVar8 < 0) {
          __n = (size_t)uVar8;
LAB_005c05dd:
          free((void *)local_d8._0_8_);
          free((void *)local_d8._8_8_);
          free(local_c8);
          return (int)__n;
        }
        uVar9 = *(uint64_t *)(auStack_40 + lVar16 * 8 + -8);
        if (uVar9 == 0xffffffffffffffff) {
          uVar9 = zip->pack_stream_inbytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar9;
        iVar12 = init_decompression(a,zip,p_Var18,(_7z_coder *)0x0);
        if (iVar12 != 0) {
          free((void *)local_d8._0_8_);
          free((void *)local_d8._8_8_);
          free(local_c8);
          goto LAB_005c0625;
        }
        local_98 = malloc(zip->folder_outbytes_remaining);
        *(void **)(local_d8 + lVar16 * 8) = local_98;
        if (local_98 == (void *)0x0) {
          free((void *)local_d8._0_8_);
          free((void *)local_d8._8_8_);
          free(local_c8);
          goto LAB_005c0686;
        }
        while (zip->pack_stream_inbytes_remaining != 0) {
          __n = extract_pack_stream(a,0);
          if (((long)__n < 0) ||
             (__n = get_uncompressed_data(a,&local_90,zip->uncompressed_buffer_bytes_remaining,0),
             (long)__n < 0)) goto LAB_005c05dd;
          lVar4 = *(long *)(local_88 + lVar16 * 8);
          memcpy((void *)((long)local_98 + lVar4),local_90,__n);
          *(size_t *)(local_88 + lVar16 * 8) = __n + lVar4;
          if (zip->pack_stream_bytes_unconsumed != 0) {
            read_consume(a);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      lVar16 = 0;
      do {
        iVar12 = local_b8[lVar16];
        zip->sub_stream_buff[lVar16] = *(uchar **)(local_d8 + (long)iVar12 * 8);
        sVar5 = *(size_t *)(local_88 + (long)iVar12 * 8);
        zip->sub_stream_size[lVar16] = sVar5;
        zip->sub_stream_bytes_remaining[lVar16] = sVar5;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      if (zip->tmp_stream_buff == (uchar *)0x0) {
        zip->tmp_stream_buff_size = 0x8000;
        puVar11 = (uchar *)malloc(0x8000);
        zip->tmp_stream_buff = puVar11;
        if (puVar11 == (uchar *)0x0) {
LAB_005c0686:
          pcVar17 = "No memory for 7-Zip decompression";
          iVar12 = 0xc;
          goto LAB_005c061e;
        }
      }
      zip->odd_bcj_size = 0;
      zip->bcj2_outPos = 0;
      zip->tmp_stream_bytes_avail = 0;
      zip->tmp_stream_bytes_remaining = 0;
      zip->pack_stream_remaining = 1;
      zip->pack_stream_index = folder->packIndex;
      uVar9 = folder_uncompressed_size(folder);
      zip->folder_outbytes_remaining = uVar9;
      zip->uncompressed_buffer_bytes_remaining = 0;
      p_Var13 = local_a0;
      coder1 = local_a8;
    }
    iVar7 = init_decompression(a,zip,coder1,p_Var13);
    iVar12 = -0x1e;
    if (iVar7 == 0) {
      iVar12 = 0;
    }
  }
  else {
    fmt = "The %s is encoded with many filters, but currently not supported";
LAB_005c023b:
    archive_set_error(&a->archive,-1,fmt,pcVar17);
LAB_005c0625:
    iVar12 = -0x1e;
  }
  return iVar12;
}

Assistant:

static int
setup_decode_folder(struct archive_read *a, struct _7z_folder *folder,
    int header)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const struct _7z_coder *coder1, *coder2;
	const char *cname = (header)?"archive header":"file content";
	unsigned i;
	int r, found_bcj2 = 0;

	/*
	 * Release the memory which the previous folder used for BCJ2.
	 */
	for (i = 0; i < 3; i++) {
		free(zip->sub_stream_buff[i]);
		zip->sub_stream_buff[i] = NULL;
	}

	/*
	 * Initialize a stream reader.
	 */
	zip->pack_stream_remaining = (unsigned)folder->numPackedStreams;
	zip->pack_stream_index = (unsigned)folder->packIndex;
	zip->folder_outbytes_remaining = folder_uncompressed_size(folder);
	zip->uncompressed_buffer_bytes_remaining = 0;

	/*
	 * Check coder types.
	 */
	for (i = 0; i < folder->numCoders; i++) {
		switch(folder->coders[i].codec) {
			case _7Z_CRYPTO_MAIN_ZIP:
			case _7Z_CRYPTO_RAR_29:
			case _7Z_CRYPTO_AES_256_SHA_256: {
				/* For entry that is associated with this folder, mark
				   it as encrypted (data+metadata). */
				zip->has_encrypted_entries = 1;
				if (a->entry) {
					archive_entry_set_is_data_encrypted(a->entry, 1);
					archive_entry_set_is_metadata_encrypted(a->entry, 1);
				}
				archive_set_error(&(a->archive),
					ARCHIVE_ERRNO_MISC,
					"The %s is encrypted, "
					"but currently not supported", cname);
				return (ARCHIVE_FATAL);
			}
			case _7Z_X86_BCJ2: {
				found_bcj2++;
				break;
			}
		}
	}
	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if ((folder->numCoders > 2 && !found_bcj2) || found_bcj2 > 1) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC,
		    "The %s is encoded with many filters, "
		    "but currently not supported", cname);
		return (ARCHIVE_FATAL);
	}
	coder1 = &(folder->coders[0]);
	if (folder->numCoders == 2)
		coder2 = &(folder->coders[1]);
	else
		coder2 = NULL;

	if (found_bcj2) {
		/*
		 * Preparation to decode BCJ2.
		 * Decoding BCJ2 requires four sources. Those are at least,
		 * as far as I know, two types of the storage form.
		 */
		const struct _7z_coder *fc = folder->coders;
		static const struct _7z_coder coder_copy = {0, 1, 1, 0, NULL};
		const struct _7z_coder *scoder[3] =
			{&coder_copy, &coder_copy, &coder_copy};
		const void *buff;
		ssize_t bytes;
		unsigned char *b[3] = {NULL, NULL, NULL};
		uint64_t sunpack[3] ={-1, -1, -1};
		size_t s[3] = {0, 0, 0};
		int idx[3] = {0, 1, 2};

		if (folder->numCoders == 4 && fc[3].codec == _7Z_X86_BCJ2 &&
		    folder->numInStreams == 7 && folder->numOutStreams == 4 &&
		    zip->pack_stream_remaining == 4) {
			/* Source type 1 made by 7zr or 7z with -m options. */
			if (folder->bindPairs[0].inIndex == 5) {
				/* The form made by 7zr */
				idx[0] = 1; idx[1] = 2; idx[2] = 0;
				scoder[1] = &(fc[1]);
				scoder[2] = &(fc[0]);
				sunpack[1] = folder->unPackSize[1];
				sunpack[2] = folder->unPackSize[0];
				coder1 = &(fc[2]);
			} else {
				/*
				 * NOTE: Some patterns do not work.
				 * work:
				 *  7z a -m0=BCJ2 -m1=COPY -m2=COPY
				 *       -m3=(any)
				 *  7z a -m0=BCJ2 -m1=COPY -m2=(any)
				 *       -m3=COPY
				 *  7z a -m0=BCJ2 -m1=(any) -m2=COPY
				 *       -m3=COPY
				 * not work:
				 *  other patterns.
				 *
				 * We have to handle this like `pipe' or
				 * our libarchive7s filter frame work,
				 * decoding the BCJ2 main stream sequentially,
				 * m3 -> m2 -> m1 -> BCJ2.
				 *
				 */
				if (fc[0].codec == _7Z_COPY &&
				    fc[1].codec == _7Z_COPY)
					coder1 = &(folder->coders[2]);
				else if (fc[0].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[1]);
				else if (fc[1].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[0]);
				else {
					archive_set_error(&(a->archive),
					    ARCHIVE_ERRNO_MISC,
					    "Unsupported form of "
					    "BCJ2 streams");
					return (ARCHIVE_FATAL);
				}
			}
			coder2 = &(fc[3]);
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[2];
		} else if (coder2 != NULL && coder2->codec == _7Z_X86_BCJ2 &&
		    zip->pack_stream_remaining == 4 &&
		    folder->numInStreams == 5 && folder->numOutStreams == 2) {
			/* Source type 0 made by 7z */
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[0];
		} else {
			/* We got an unexpected form. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unsupported form of BCJ2 streams");
			return (ARCHIVE_FATAL);
		}

		/* Skip the main stream at this time. */
		if ((r = seek_pack(a)) < 0)
			return (r);
		zip->pack_stream_bytes_unconsumed =
		    (size_t)zip->pack_stream_inbytes_remaining;
		read_consume(a);

		/* Read following three sub streams. */
		for (i = 0; i < 3; i++) {
			const struct _7z_coder *coder = scoder[i];

			if ((r = seek_pack(a)) < 0) {
				free(b[0]); free(b[1]); free(b[2]);
				return (r);
			}

			if (sunpack[i] == (uint64_t)-1)
				zip->folder_outbytes_remaining =
				    zip->pack_stream_inbytes_remaining;
			else
				zip->folder_outbytes_remaining = sunpack[i];

			r = init_decompression(a, zip, coder, NULL);
			if (r != ARCHIVE_OK) {
				free(b[0]); free(b[1]); free(b[2]);
				return (ARCHIVE_FATAL);
			}

			/* Allocate memory for the decoded data of a sub
			 * stream. */
			b[i] = malloc((size_t)zip->folder_outbytes_remaining);
			if (b[i] == NULL) {
				free(b[0]); free(b[1]); free(b[2]);
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}

			/* Extract a sub stream. */
			while (zip->pack_stream_inbytes_remaining > 0) {
				r = (int)extract_pack_stream(a, 0);
				if (r < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return (r);
				}
				bytes = get_uncompressed_data(a, &buff,
				    zip->uncompressed_buffer_bytes_remaining,
				    0);
				if (bytes < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return ((int)bytes);
				}
				memcpy(b[i]+s[i], buff, bytes);
				s[i] += bytes;
				if (zip->pack_stream_bytes_unconsumed)
					read_consume(a);
			}
		}

		/* Set the sub streams to the right place. */
		for (i = 0; i < 3; i++) {
			zip->sub_stream_buff[i] = b[idx[i]];
			zip->sub_stream_size[i] = s[idx[i]];
			zip->sub_stream_bytes_remaining[i] = s[idx[i]];
		}

		/* Allocate memory used for decoded main stream bytes. */
		if (zip->tmp_stream_buff == NULL) {
			zip->tmp_stream_buff_size = 32 * 1024;
			zip->tmp_stream_buff =
			    malloc(zip->tmp_stream_buff_size);
			if (zip->tmp_stream_buff == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zip->tmp_stream_bytes_avail = 0;
		zip->tmp_stream_bytes_remaining = 0;
		zip->odd_bcj_size = 0;
		zip->bcj2_outPos = 0;

		/*
		 * Reset a stream reader in order to read the main stream
		 * of BCJ2.
		 */
		zip->pack_stream_remaining = 1;
		zip->pack_stream_index = (unsigned)folder->packIndex;
		zip->folder_outbytes_remaining =
		    folder_uncompressed_size(folder);
		zip->uncompressed_buffer_bytes_remaining = 0;
	}

	/*
	 * Initialize the decompressor for the new folder's pack streams.
	 */
	r = init_decompression(a, zip, coder1, coder2);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}